

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void nonce_function_bip340_bitflip
               (uchar **args,size_t n_flip,size_t n_bytes,size_t msglen,size_t algolen)

{
  int iVar1;
  uchar nonces [2] [32];
  size_t in_stack_ffffffffffffff98;
  uchar *in_stack_ffffffffffffffa0;
  undefined1 auStack_48 [72];
  
  iVar1 = nonce_function_bip340
                    ((uchar *)nonces[1]._24_8_,(uchar *)nonces[1]._16_8_,nonces[1]._8_8_,
                     (uchar *)nonces[1]._0_8_,(uchar *)nonces[0]._24_8_,(uchar *)nonces[0]._16_8_,
                     n_bytes,(void *)n_flip);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_impl.h"
            ,0x11,
            "test condition failed: nonce_function_bip340(nonces[0], args[0], msglen, args[1], args[2], args[3], algolen, args[4]) == 1"
           );
    abort();
  }
  secp256k1_testrand_flip(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  iVar1 = nonce_function_bip340
                    ((uchar *)nonces[1]._24_8_,(uchar *)nonces[1]._16_8_,nonces[1]._8_8_,
                     (uchar *)nonces[1]._0_8_,(uchar *)nonces[0]._24_8_,(uchar *)nonces[0]._16_8_,
                     n_bytes,(void *)n_flip);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_impl.h"
            ,0x13,
            "test condition failed: nonce_function_bip340(nonces[1], args[0], msglen, args[1], args[2], args[3], algolen, args[4]) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_memcmp_var(&stack0xffffffffffffff98,auStack_48,0x20);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/tests_impl.h"
            ,0x14,"test condition failed: secp256k1_memcmp_var(nonces[0], nonces[1], 32) != 0");
    abort();
  }
  return;
}

Assistant:

static void nonce_function_bip340_bitflip(unsigned char **args, size_t n_flip, size_t n_bytes, size_t msglen, size_t algolen) {
    unsigned char nonces[2][32];
    CHECK(nonce_function_bip340(nonces[0], args[0], msglen, args[1], args[2], args[3], algolen, args[4]) == 1);
    secp256k1_testrand_flip(args[n_flip], n_bytes);
    CHECK(nonce_function_bip340(nonces[1], args[0], msglen, args[1], args[2], args[3], algolen, args[4]) == 1);
    CHECK(secp256k1_memcmp_var(nonces[0], nonces[1], 32) != 0);
}